

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  ImSpan<signed_char> *this;
  ImSpan<ImGuiTableColumn> *this_00;
  float fVar1;
  byte bVar2;
  char cVar3;
  ImU8 IVar4;
  uint uVar5;
  uint uVar6;
  ImGuiWindow *pIVar7;
  float fVar8;
  ImVec2 IVar9;
  ImGuiContext_conflict1 *pIVar10;
  _Bool _Var11;
  char cVar12;
  ImGuiID id;
  byte *pbVar13;
  ImGuiTableColumn *pIVar14;
  ImGuiTableColumn *pIVar15;
  char *pcVar16;
  bool bVar17;
  uint uVar18;
  bool bVar19;
  uint i;
  ulong uVar20;
  int column_n;
  uint uVar21;
  ulong uVar22;
  int column_n_1;
  int iVar23;
  bool bVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float local_d0;
  float local_cc;
  float local_c8;
  ImRect host_clip_rect;
  ImRect local_40;
  
  pIVar10 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x2ce,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  uVar18 = table->Flags & 0xe000;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  table->LeftMostEnabledColumn = -1;
  fVar29 = (pIVar10->Style).FramePadding.x;
  fVar26 = 1.0;
  if (1.0 <= fVar29) {
    fVar26 = fVar29;
  }
  table->MinColumnWidth = fVar26;
  this = &table->DisplayOrderToIndex;
  this_00 = &table->Columns;
  uVar25 = 0xffffffff;
  i = 0;
  fVar29 = 0.0;
  local_cc = 0.0;
  bVar17 = false;
  bVar19 = false;
  local_d0 = 0.0;
  cVar12 = '\0';
  while( true ) {
    uVar21 = table->ColumnsCount;
    if ((int)uVar21 <= (int)i) break;
    pbVar13 = (byte *)ImSpan<signed_char>::operator[](this,i);
    bVar2 = *pbVar13;
    uVar21 = (uint)(char)bVar2;
    if (i != uVar21) {
      table->IsDefaultDisplayOrder = false;
    }
    pIVar14 = ImSpan<ImGuiTableColumn>::operator[](this_00,uVar21);
    if (table->DeclColumnsCount <= (char)bVar2) {
      TableSetupColumnFlags(table,pIVar14,0);
      pIVar14->NameOffset = -1;
      pIVar14->UserID = 0;
      pIVar14->InitStretchWeightOrWidth = -1.0;
    }
    uVar5 = table->Flags;
    if (((uVar5 & 4) == 0) || ((pIVar14->Flags & 0x80) != 0)) {
      pIVar14->IsUserEnabledNextFrame = true;
      _Var11 = true;
    }
    else {
      _Var11 = pIVar14->IsUserEnabledNextFrame;
    }
    if (pIVar14->IsUserEnabled != _Var11) {
      pIVar14->IsUserEnabled = _Var11;
      table->IsSettingsDirty = true;
    }
    uVar6 = pIVar14->Flags;
    _Var11 = (_Bool)(_Var11 & (uVar6 & 1) == 0);
    pIVar14->IsEnabled = _Var11;
    if (((uVar5 >> 0x1a & 1) == 0 && '\0' < pIVar14->SortOrder) ||
       (pIVar14->SortOrder != -1 && _Var11 == false)) {
      table->IsSortSpecsDirty = true;
    }
    if ((&pIVar14->WidthRequest)[(ulong)((uVar6 & 0x10) == 0) * 2] <= 0.0 &&
        (&pIVar14->WidthRequest)[(ulong)((uVar6 & 0x10) == 0) * 2] != 0.0) {
      pIVar14->AutoFitQueue = '\a';
      pIVar14->CannotSkipItemsQueue = '\a';
    }
    if (_Var11 == false) {
      pIVar14->IndexWithinEnabledSet = -1;
    }
    else {
      pIVar14->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar25;
      pIVar14->NextEnabledColumn = -1;
      if (uVar25 == 0xffffffff) {
        table->LeftMostEnabledColumn = bVar2;
      }
      else {
        pIVar15 = ImSpan<ImGuiTableColumn>::operator[](this_00,uVar25);
        pIVar15->NextEnabledColumn = bVar2;
      }
      cVar3 = table->ColumnsEnabledCount;
      table->ColumnsEnabledCount = cVar3 + '\x01';
      pIVar14->IndexWithinEnabledSet = cVar3;
      table->EnabledMaskByIndex = table->EnabledMaskByIndex | 1L << (bVar2 & 0x3f);
      bVar2 = pIVar14->DisplayOrder;
      table->EnabledMaskByDisplayOrder = table->EnabledMaskByDisplayOrder | 1L << (bVar2 & 0x3f);
      if ((char)bVar2 < cVar3) {
        __assert_fail("column->IndexWithinEnabledSet <= column->DisplayOrder",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                      ,0x318,"void ImGui::TableUpdateLayout(ImGuiTable *)");
      }
      if (pIVar14->IsPreserveWidthAuto == false) {
        fVar26 = TableGetColumnWidthAuto(table,pIVar14);
        pIVar14->WidthAuto = fVar26;
      }
      uVar5 = pIVar14->Flags;
      if ((uVar5 & 0x20) == 0) {
        bVar17 = true;
      }
      if ((((uVar5 & 0x10) != 0) && ((uVar5 & 0x20) != 0)) &&
         (0.0 < pIVar14->InitStretchWeightOrWidth)) {
        pIVar14->WidthAuto = pIVar14->InitStretchWeightOrWidth;
      }
      bVar19 = (bool)(bVar19 | pIVar14->AutoFitQueue != '\0');
      fVar26 = pIVar14->WidthAuto;
      uVar25 = uVar21;
      if ((uVar5 & 8) == 0) {
        fVar29 = (float)((uint)fVar29 & -(uint)(fVar26 <= fVar29) |
                        ~-(uint)(fVar26 <= fVar29) & (uint)fVar26);
        cVar12 = cVar12 + '\x01';
      }
      else {
        local_cc = local_cc + fVar26;
        local_d0 = (float)((int)local_d0 + 1);
      }
    }
    i = i + 1;
  }
  if ((((table->Flags & 8U) != 0) && (((uint)table->Flags >> 0x1b & 1) == 0)) &&
     (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (ImGuiTableColumnIdx)uVar25;
  if ((table->LeftMostEnabledColumn < '\0') || ((uVar25 & 0x80) != 0)) {
    __assert_fail("table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x336,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  if (bVar19) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  fVar27 = (float)(int)local_d0;
  local_d0 = 0.0;
  fVar26 = 0.0;
  for (uVar22 = 0; (long)uVar22 < (long)(int)uVar21; uVar22 = uVar22 + 1) {
    bVar2 = (byte)uVar22;
    if ((table->EnabledMaskByIndex >> (uVar22 & 0x3f) & 1) != 0) {
      pIVar14 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)uVar22);
      uVar25 = pIVar14->Flags;
      if ((uVar25 & 0x10) == 0) {
        if ((((uVar25 & 0x20) != 0) || (pIVar14->AutoFitQueue != '\0')) ||
           (fVar28 = pIVar14->StretchWeight, fVar28 < 0.0)) {
          if (uVar18 == 0x6000) {
            fVar28 = (pIVar14->WidthAuto / local_cc) * fVar27;
          }
          else {
            fVar28 = 1.0;
          }
          uVar25 = -(uint)(0.0 < pIVar14->InitStretchWeightOrWidth);
          fVar28 = (float)(uVar25 & (uint)pIVar14->InitStretchWeightOrWidth | ~uVar25 & (uint)fVar28
                          );
          pIVar14->StretchWeight = fVar28;
        }
        if ((table->LeftMostStretchedColumn == -1) ||
           (pIVar15 = ImSpan<ImGuiTableColumn>::operator[]
                                (this_00,(int)table->LeftMostStretchedColumn),
           pIVar14->DisplayOrder < pIVar15->DisplayOrder)) {
          table->LeftMostStretchedColumn = bVar2;
        }
        local_d0 = local_d0 + fVar28;
        if ((table->RightMostStretchedColumn == -1) ||
           (pIVar15 = ImSpan<ImGuiTableColumn>::operator[]
                                (this_00,(int)table->RightMostStretchedColumn),
           pIVar15->DisplayOrder < pIVar14->DisplayOrder)) {
          table->RightMostStretchedColumn = bVar2;
        }
      }
      else {
        IVar4 = pIVar14->AutoFitQueue;
        if (uVar18 == 0x4000) {
          fVar28 = fVar29;
          if ((uVar25 & 0x20) != 0 || IVar4 != '\0') goto LAB_001f743d;
        }
        else {
          fVar28 = pIVar14->WidthAuto;
LAB_001f743d:
          if (IVar4 == '\0') {
            if (((uVar25 & 0x20) != 0) &&
               ((table->RequestOutputMaskByIndex & 1L << (bVar2 & 0x3f)) != 0)) {
              pIVar14->WidthRequest = fVar28;
            }
          }
          else {
            pIVar14->WidthRequest = fVar28;
            if (((IVar4 != '\x01') && (table->IsInitializing == true)) &&
               (pIVar14->IsPreserveWidthAuto == false)) {
              fVar30 = table->MinColumnWidth * 4.0;
              uVar25 = -(uint)(fVar30 <= fVar28);
              pIVar14->WidthRequest = (float)(~uVar25 & (uint)fVar30 | (uint)fVar28 & uVar25);
            }
          }
        }
        fVar26 = fVar26 + pIVar14->WidthRequest;
      }
      pIVar14->IsPreserveWidthAuto = false;
      fVar26 = fVar26 + table->CellPaddingX + table->CellPaddingX;
      uVar21 = table->ColumnsCount;
    }
  }
  table->ColumnsEnabledFixedCount = cVar12;
  fVar29 = (table->WorkRect).Min.x;
  fVar27 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsEnabledCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((table->Flags & 0x1000000) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth)))
  {
    fVar28 = (table->WorkRect).Max.x - fVar29;
  }
  else {
    fVar28 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar30 = (table->WorkRect).Min.y;
  fVar26 = (fVar28 - fVar27) - fVar26;
  table->ColumnsGivenWidth =
       (float)(int)table->ColumnsEnabledCount * (table->CellPaddingX + table->CellPaddingX) + fVar27
  ;
  local_c8 = fVar26;
  for (uVar22 = 0; (long)uVar22 < (long)(int)uVar21; uVar22 = uVar22 + 1) {
    if ((table->EnabledMaskByIndex >> (uVar22 & 0x3f) & 1) != 0) {
      pIVar14 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)uVar22);
      if ((pIVar14->Flags & 8U) != 0) {
        fVar27 = (pIVar14->StretchWeight / local_d0) * fVar26;
        uVar18 = -(uint)(table->MinColumnWidth <= fVar27);
        fVar27 = (float)(int)((float)(~uVar18 & (uint)table->MinColumnWidth | (uint)fVar27 & uVar18)
                             + 0.01);
        pIVar14->WidthRequest = fVar27;
        local_c8 = local_c8 - fVar27;
      }
      if ((pIVar14->NextEnabledColumn == -1) && (table->LeftMostStretchedColumn != -1)) {
        pIVar14->Flags = pIVar14->Flags | 0x40000000;
      }
      uVar18 = -(uint)(table->MinColumnWidth <= pIVar14->WidthRequest);
      fVar27 = (float)(int)(float)(~uVar18 & (uint)table->MinColumnWidth |
                                  (uint)pIVar14->WidthRequest & uVar18);
      pIVar14->WidthGiven = fVar27;
      table->ColumnsGivenWidth = fVar27 + table->ColumnsGivenWidth;
      uVar21 = table->ColumnsCount;
    }
  }
  if (((1.0 <= local_c8) && ((table->Flags & 0x80000) == 0)) && (0.0 < local_d0)) {
    uVar22 = (ulong)uVar21;
    do {
      uVar20 = uVar22 & 0xffffffff;
      do {
        do {
          uVar22 = uVar22 - 1;
          if ((local_c8 < 1.0) || ((int)uVar20 < 1)) goto LAB_001f772a;
          uVar18 = (int)uVar20 - 1;
          uVar20 = (ulong)uVar18;
        } while ((table->EnabledMaskByDisplayOrder >> (uVar22 & 0x3f) & 1) == 0);
        pcVar16 = ImSpan<signed_char>::operator[](this,uVar18);
        pIVar14 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)*pcVar16);
      } while ((pIVar14->Flags & 8) == 0);
      pIVar14->WidthRequest = pIVar14->WidthRequest + 1.0;
      pIVar14->WidthGiven = pIVar14->WidthGiven + 1.0;
      local_c8 = local_c8 + -1.0;
    } while( true );
  }
LAB_001f772a:
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar26 = (table->OuterRect).Max.y;
  local_40.Min = (table->OuterRect).Min;
  fVar27 = local_40.Min.y + table->LastOuterHeight;
  uVar18 = -(uint)(fVar27 <= fVar26);
  local_40.Max.y = (float)(uVar18 & (uint)fVar26 | ~uVar18 & (uint)fVar27);
  iVar23 = 0;
  _Var11 = ItemHoverable(&local_40,0);
  bVar19 = '\0' < table->FreezeColumnsCount;
  fVar26 = fVar29;
  if ('\0' < table->FreezeColumnsCount) {
    fVar26 = (table->OuterRect).Min.x;
  }
  fVar26 = (fVar26 + table->OuterPaddingX) - table->CellSpacingX1;
  host_clip_rect.Min = (table->InnerClipRect).Min;
  host_clip_rect.Max = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar22 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar22) {
      fVar29 = (table->WorkRect).Min.x;
      pIVar14 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)table->RightMostEnabledColumn);
      fVar26 = (pIVar14->ClipRect).Max.x;
      uVar18 = -(uint)(fVar26 <= fVar29);
      fVar29 = (float)(uVar18 & (uint)fVar29 | ~uVar18 & (uint)fVar26);
      if (((_Var11) && (table->HoveredColumnBody == -1)) && (fVar29 <= (pIVar10->IO).MousePos.x)) {
        table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
      }
      uVar18 = table->Flags;
      if (!bVar17 && (uVar18 & 1) != 0) {
        uVar18 = uVar18 & 0xfffffffe;
        table->Flags = uVar18;
      }
      if (table->RightMostStretchedColumn != -1) {
        uVar18 = uVar18 & 0xfffeffff;
        table->Flags = uVar18;
      }
      if ((uVar18 >> 0x10 & 1) != 0) {
        (table->WorkRect).Max.x = fVar29;
        (table->OuterRect).Max.x = fVar29;
        fVar26 = (table->InnerClipRect).Max.x;
        if (fVar29 <= fVar26) {
          fVar26 = fVar29;
        }
        (table->InnerClipRect).Max.x = fVar26;
      }
      pIVar7 = table->InnerWindow;
      IVar9 = (table->WorkRect).Max;
      (pIVar7->ParentWorkRect).Min = (table->WorkRect).Min;
      (pIVar7->ParentWorkRect).Max = IVar9;
      fVar29 = (table->InnerClipRect).Max.x;
      table->BorderX1 = (table->InnerClipRect).Min.x;
      table->BorderX2 = fVar29;
      TableSetupDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        _Var11 = BeginPopupEx(id,0x141);
        if (_Var11) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      uVar18 = table->Flags;
      if (((byte)((uVar18 & 8) >> 3) & table->IsSortSpecsDirty) == 1) {
        TableSortSpecsBuild(table);
        uVar18 = table->Flags;
      }
      pIVar7 = table->InnerWindow;
      if ((uVar18 >> 0x14 & 1) == 0) {
        ImDrawList::PushClipRect
                  (pIVar7->DrawList,(pIVar7->ClipRect).Min,(pIVar7->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar7->DrawList,2);
      }
      return;
    }
    pbVar13 = (byte *)ImSpan<signed_char>::operator[](this,(int)uVar22);
    bVar2 = *pbVar13;
    pIVar14 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)(char)bVar2);
    bVar24 = true;
    if (table->FreezeRowsCount < '\x01') {
      bVar24 = (char)bVar2 < table->FreezeColumnsCount;
    }
    pIVar14->NavLayerCurrent = bVar24;
    if (bVar19) {
      bVar19 = true;
      if (iVar23 == table->FreezeColumnsCount) {
        fVar26 = fVar26 + (fVar29 - (table->OuterRect).Min.x);
        goto LAB_001f7863;
      }
    }
    else {
LAB_001f7863:
      bVar19 = false;
    }
    pbVar13 = (byte *)((long)&pIVar14->Flags + 3);
    *pbVar13 = *pbVar13 & 0xf0;
    if ((table->EnabledMaskByDisplayOrder >> (uVar22 & 0x3f) & 1) == 0) {
      (pIVar14->ClipRect).Max.x = fVar26;
      (pIVar14->ClipRect).Min.x = fVar26;
      pIVar14->WorkMinX = fVar26;
      pIVar14->MaxX = fVar26;
      pIVar14->MinX = fVar26;
      pIVar14->WidthGiven = 0.0;
      (pIVar14->ClipRect).Min.y = fVar30;
      (pIVar14->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar14->ClipRect,&host_clip_rect);
      pIVar14->IsVisibleX = false;
      pIVar14->IsVisibleY = false;
      pIVar14->IsRequestOutput = false;
      pIVar14->IsSkipItems = true;
      pIVar14->ItemWidth = 1.0;
    }
    else {
      if (((_Var11) && (fVar27 = (pIVar10->IO).MousePos.x, (pIVar14->ClipRect).Min.x <= fVar27)) &&
         (fVar27 < (pIVar14->ClipRect).Max.x)) {
        table->HoveredColumnBody = bVar2;
      }
      pIVar14->MinX = fVar26;
      fVar28 = TableGetMaxColumnWidth(table,(int)(char)bVar2);
      fVar27 = pIVar14->WidthGiven;
      if (fVar28 <= pIVar14->WidthGiven) {
        fVar27 = fVar28;
      }
      fVar28 = pIVar14->WidthRequest;
      if (table->MinColumnWidth <= pIVar14->WidthRequest) {
        fVar28 = table->MinColumnWidth;
      }
      fVar8 = (float)(~-(uint)(fVar28 <= fVar27) & (uint)fVar28 |
                     (uint)fVar27 & -(uint)(fVar28 <= fVar27));
      pIVar14->WidthGiven = fVar8;
      fVar27 = table->CellPaddingX;
      fVar28 = table->CellSpacingX1;
      fVar1 = table->CellSpacingX2;
      fVar31 = fVar27 + fVar27 + fVar8 + fVar26 + fVar28 + fVar1;
      pIVar14->MaxX = fVar31;
      pIVar14->WorkMinX = fVar27 + pIVar14->MinX + fVar28;
      pIVar14->WorkMaxX = (fVar31 - fVar27) - fVar1;
      pIVar14->ItemWidth = (float)(int)(fVar8 * 0.65);
      (pIVar14->ClipRect).Min.x = pIVar14->MinX;
      (pIVar14->ClipRect).Min.y = fVar30;
      (pIVar14->ClipRect).Max.x = fVar31;
      (pIVar14->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar14->ClipRect,&host_clip_rect);
      fVar27 = (pIVar14->ClipRect).Min.x;
      fVar28 = (pIVar14->ClipRect).Max.x;
      pIVar14->IsVisibleX = fVar27 < fVar28;
      pIVar14->IsVisibleY = true;
      if (fVar28 <= fVar27) {
        if (pIVar14->AutoFitQueue != '\0') goto LAB_001f7a5a;
        bVar24 = pIVar14->CannotSkipItemsQueue != '\0';
        pIVar14->IsRequestOutput = bVar24;
        if (bVar24) goto LAB_001f7a66;
      }
      else {
        table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar2 & 0x3f);
LAB_001f7a5a:
        pIVar14->IsRequestOutput = true;
LAB_001f7a66:
        table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar2 & 0x3f);
      }
      bVar24 = true;
      if (pIVar14->IsEnabled == true) {
        bVar24 = table->HostSkipItems;
      }
      pIVar14->IsSkipItems = bVar24;
      if (bVar24 == true && fVar27 < fVar28) {
        __assert_fail("!is_visible",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                      ,0x406,"void ImGui::TableUpdateLayout(ImGuiTable *)");
      }
      uVar18 = (uint)(fVar27 < fVar28) << 0x19 | pIVar14->Flags;
      uVar25 = uVar18 | 0x1000000;
      pIVar14->Flags = uVar25;
      if (pIVar14->SortOrder != -1) {
        uVar25 = uVar18 | 0x5000000;
        pIVar14->Flags = uVar25;
      }
      if (table->HoveredColumnBody == bVar2) {
        pIVar14->Flags = uVar25 | 0x8000000;
      }
      fVar27 = pIVar14->WorkMinX;
      pIVar14->ContentMaxXFrozen = fVar27;
      pIVar14->ContentMaxXUnfrozen = fVar27;
      pIVar14->ContentMaxXHeadersUsed = fVar27;
      pIVar14->ContentMaxXHeadersIdeal = fVar27;
      if (table->HostSkipItems == false) {
        pIVar14->AutoFitQueue = pIVar14->AutoFitQueue >> 1;
        pIVar14->CannotSkipItemsQueue = pIVar14->CannotSkipItemsQueue >> 1;
      }
      if (iVar23 < table->FreezeColumnsCount) {
        fVar28 = pIVar14->MaxX + 1.0;
        fVar27 = host_clip_rect.Max.x;
        if (fVar28 <= host_clip_rect.Max.x) {
          fVar27 = fVar28;
        }
        host_clip_rect.Min.x =
             (float)(-(uint)(fVar28 < host_clip_rect.Min.x) & (uint)host_clip_rect.Min.x |
                    ~-(uint)(fVar28 < host_clip_rect.Min.x) & (uint)fVar27);
      }
      fVar26 = fVar26 + table->CellPaddingX + table->CellPaddingX +
                        pIVar14->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
      iVar23 = iVar23 + 1;
    }
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->LeftMostEnabledColumn = -1;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int prev_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings and sort specs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsUserEnabledNextFrame = true;
        if (column->IsUserEnabled != column->IsUserEnabledNextFrame)
        {
            column->IsUserEnabled = column->IsUserEnabledNextFrame;
            table->IsSettingsDirty = true;
        }
        column->IsEnabled = column->IsUserEnabled && (column->Flags & ImGuiTableColumnFlags_Disabled) == 0;

        if (column->SortOrder != -1 && !column->IsEnabled)
            table->IsSortSpecsDirty = true;
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (prev_visible_column_idx != -1)
            table->Columns[prev_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        else
            table->LeftMostEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        prev_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
    IM_ASSERT(table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto;

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter->SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}